

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool readParseCache(ParseCacheMap *entries,QString *parseCacheFilePath)

{
  initializer_list<QString> args;
  initializer_list<QString> args_00;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  bool bVar1;
  bool bVar2;
  QFlags<QIODeviceBase::OpenModeFlag> QVar3;
  uint uVar4;
  char *pcVar5;
  qsizetype qVar6;
  char *pcVar7;
  int __oflag;
  int __fd;
  QString *in_RSI;
  ParseCacheEntry *in_RDI;
  long in_FS_OFFSET;
  bool mmc_key_found;
  QString line;
  QString udpKey;
  QString mdpKey;
  QString midKey;
  QString uicKey;
  QString miuKey;
  QString mmcKey;
  QTextStream textStream;
  QStringList mocIncludes;
  QStringList mocEntries;
  QString source;
  QFile file;
  undefined4 in_stack_fffffffffffffd18;
  CaseSensitivity in_stack_fffffffffffffd1c;
  ParseCacheEntry *in_stack_fffffffffffffd20;
  QIODevice *in_stack_fffffffffffffd28;
  FILE *pFVar8;
  QString *in_stack_fffffffffffffd30;
  undefined6 in_stack_fffffffffffffd38;
  QChar in_stack_fffffffffffffd3e;
  char *in_stack_fffffffffffffd50;
  qsizetype in_stack_fffffffffffffd58;
  bool local_211;
  initializer_list<QString> local_180;
  initializer_list<QString> local_170 [4];
  QChar local_12a;
  QString local_128;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  QString local_e0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  QString local_b0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  QFile local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.super_QFileDevice.super_QIODevice._vptr_QIODevice = (_func_int **)0xaaaaaaaaaaaaaaaa;
  local_18.super_QFileDevice.super_QIODevice.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       (__uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>)0xaaaaaaaaaaaaaaaa
  ;
  QFile::QFile((QFile *)in_stack_fffffffffffffd30,(QString *)in_stack_fffffffffffffd28);
  QVar3 = operator|((enum_type)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                    (enum_type)in_stack_fffffffffffffd20);
  uVar4 = QFile::open(&local_18,
                      (char *)(ulong)(uint)QVar3.
                                           super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                           .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,
                      __oflag);
  if ((uVar4 & 1) == 0) {
    pFVar8 = _stderr;
    QtPrivate::asString(in_RSI);
    QString::toLocal8Bit
              ((QString *)CONCAT26(in_stack_fffffffffffffd3e.ucs,in_stack_fffffffffffffd38));
    pcVar5 = QByteArray::constData((QByteArray *)0x1078f2);
    fprintf(pFVar8,"Could not open: %s\n",pcVar5);
    QByteArray::~QByteArray((QByteArray *)0x107915);
    local_211 = false;
  }
  else {
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x107967);
    local_60 = 0xaaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)0x1079a1);
    local_78 = 0xaaaaaaaaaaaaaaaa;
    local_70 = 0xaaaaaaaaaaaaaaaa;
    local_68 = 0xaaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)0x1079db);
    local_80 = 0xaaaaaaaaaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    local_98 = 0xaaaaaaaaaaaaaaaa;
    local_90 = 0xaaaaaaaaaaaaaaaa;
    local_88 = 0xaaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
    latin1.m_size = in_stack_fffffffffffffd58;
    latin1.m_data = in_stack_fffffffffffffd50;
    QString::QString(in_stack_fffffffffffffd30,latin1);
    local_b0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_b0.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_b0.d.size = -0x5555555555555556;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
    latin1_00.m_size = in_stack_fffffffffffffd58;
    latin1_00.m_data = in_stack_fffffffffffffd50;
    QString::QString(in_stack_fffffffffffffd30,latin1_00);
    local_c8 = 0xaaaaaaaaaaaaaaaa;
    local_c0 = 0xaaaaaaaaaaaaaaaa;
    local_b8 = 0xaaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
    latin1_01.m_size = in_stack_fffffffffffffd58;
    latin1_01.m_data = in_stack_fffffffffffffd50;
    QString::QString(in_stack_fffffffffffffd30,latin1_01);
    local_e0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_e0.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_e0.d.size = -0x5555555555555556;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
    latin1_02.m_size = in_stack_fffffffffffffd58;
    latin1_02.m_data = in_stack_fffffffffffffd50;
    QString::QString(in_stack_fffffffffffffd30,latin1_02);
    local_f8 = 0xaaaaaaaaaaaaaaaa;
    local_f0 = 0xaaaaaaaaaaaaaaaa;
    local_e8 = 0xaaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
    latin1_03.m_size = in_stack_fffffffffffffd58;
    latin1_03.m_data = in_stack_fffffffffffffd50;
    QString::QString(in_stack_fffffffffffffd30,latin1_03);
    local_110 = 0xaaaaaaaaaaaaaaaa;
    local_108 = 0xaaaaaaaaaaaaaaaa;
    local_100 = 0xaaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
    latin1_04.m_size = in_stack_fffffffffffffd58;
    latin1_04.m_data = in_stack_fffffffffffffd50;
    QString::QString(in_stack_fffffffffffffd30,latin1_04);
    local_128.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_128.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_128.d.size = -0x5555555555555556;
    QString::QString((QString *)0x107c9d);
    bVar1 = false;
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              __fd = (int)&local_128;
              bVar2 = QTextStream::readLineInto
                                ((QTextStream *)in_stack_fffffffffffffd30,
                                 (QString *)in_stack_fffffffffffffd28,
                                 (qint64)in_stack_fffffffffffffd20);
              if (!bVar2) {
                bVar2 = QList<QString>::isEmpty((QList<QString> *)0x10806c);
                if (((!bVar2) ||
                    (bVar2 = QList<QString>::isEmpty((QList<QString> *)0x10807f), !bVar2)) ||
                   (bVar1)) {
                  QList<QString>::QList
                            (&in_RDI->mocFiles,
                             (QList<QString> *)
                             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
                  QList<QString>::QList
                            (&in_RDI->mocFiles,
                             (QList<QString> *)
                             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
                  __fd = (int)&local_48;
                  QMap<QString,_ParseCacheEntry>::insert
                            ((QMap<QString,_ParseCacheEntry> *)in_stack_fffffffffffffd30,
                             (QString *)in_stack_fffffffffffffd28,in_RDI);
                  ParseCacheEntry::~ParseCacheEntry(in_RDI);
                  in_stack_fffffffffffffd20 = in_RDI;
                }
                QFileDevice::close(&local_18.super_QFileDevice,__fd);
                local_211 = true;
                goto LAB_00108113;
              }
              QChar::QChar<char16_t,_true>(&local_12a,L' ');
              bVar2 = QString::startsWith((QString *)in_stack_fffffffffffffd28,
                                          in_stack_fffffffffffffd3e,
                                          (CaseSensitivity)
                                          ((ulong)in_stack_fffffffffffffd20 >> 0x20));
              if (bVar2) break;
              bVar2 = QList<QString>::isEmpty((QList<QString> *)0x107d05);
              if (((!bVar2) || (bVar1)) ||
                 (bVar2 = QList<QString>::isEmpty((QList<QString> *)0x107d1f), !bVar2)) {
                QList<QString>::QList
                          (&in_stack_fffffffffffffd20->mocFiles,
                           (QList<QString> *)
                           CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
                QList<QString>::QList
                          (&in_stack_fffffffffffffd20->mocFiles,
                           (QList<QString> *)
                           CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
                QMap<QString,_ParseCacheEntry>::insert
                          ((QMap<QString,_ParseCacheEntry> *)in_stack_fffffffffffffd30,
                           (QString *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
                ParseCacheEntry::~ParseCacheEntry(in_stack_fffffffffffffd20);
                QString::clear((QString *)in_stack_fffffffffffffd20);
                std::initializer_list<QString>::initializer_list(local_170);
                args._M_len._0_6_ = in_stack_fffffffffffffd38;
                args._M_array = in_stack_fffffffffffffd30;
                args._M_len._6_2_ = in_stack_fffffffffffffd3e.ucs;
                QList<QString>::operator=
                          ((QList<QString> *)
                           CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),args);
                std::initializer_list<QString>::initializer_list(&local_180);
                args_00._M_len._0_6_ = in_stack_fffffffffffffd38;
                args_00._M_array = in_stack_fffffffffffffd30;
                args_00._M_len._6_2_ = in_stack_fffffffffffffd3e.ucs;
                QList<QString>::operator=
                          ((QList<QString> *)
                           CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),args_00);
                bVar1 = false;
              }
              QString::operator=((QString *)in_stack_fffffffffffffd20,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
            }
            bVar2 = QString::startsWith((QString *)in_stack_fffffffffffffd28,
                                        (QString *)in_stack_fffffffffffffd20,
                                        in_stack_fffffffffffffd1c);
            if (!bVar2) break;
            bVar1 = true;
          }
          bVar2 = QString::startsWith((QString *)in_stack_fffffffffffffd28,
                                      (QString *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c
                                     );
          if (!bVar2) break;
          QString::size(&local_128);
          QString::size(&local_b0);
          QString::right((QString *)
                         CONCAT26(in_stack_fffffffffffffd3e.ucs,in_stack_fffffffffffffd38),
                         (qsizetype)in_stack_fffffffffffffd30);
          QList<QString>::push_back
                    (&in_stack_fffffffffffffd20->mocFiles,
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          QString::~QString((QString *)0x107eb6);
        }
        bVar2 = QString::startsWith((QString *)in_stack_fffffffffffffd28,
                                    (QString *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
        if (!bVar2) break;
        qVar6 = QString::size(&local_128);
        in_stack_fffffffffffffd38 = (undefined6)qVar6;
        in_stack_fffffffffffffd3e.ucs = (char16_t)((ulong)qVar6 >> 0x30);
        QString::size(&local_e0);
        QString::right((QString *)CONCAT26(in_stack_fffffffffffffd3e.ucs,in_stack_fffffffffffffd38),
                       (qsizetype)in_stack_fffffffffffffd30);
        QList<QString>::push_back
                  (&in_stack_fffffffffffffd20->mocFiles,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        QString::~QString((QString *)0x107f39);
      }
      bVar2 = QString::startsWith((QString *)in_stack_fffffffffffffd28,
                                  (QString *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
    } while (((bVar2) ||
             (bVar2 = QString::startsWith((QString *)in_stack_fffffffffffffd28,
                                          (QString *)in_stack_fffffffffffffd20,
                                          in_stack_fffffffffffffd1c), bVar2)) ||
            (bVar2 = QString::startsWith((QString *)in_stack_fffffffffffffd28,
                                         (QString *)in_stack_fffffffffffffd20,
                                         in_stack_fffffffffffffd1c), bVar2));
    pFVar8 = _stderr;
    QtPrivate::asString(&local_128);
    QString::toLocal8Bit
              ((QString *)CONCAT26(in_stack_fffffffffffffd3e.ucs,in_stack_fffffffffffffd38));
    pcVar5 = QByteArray::constData((QByteArray *)0x107fd8);
    QtPrivate::asString(in_RSI);
    QString::toLocal8Bit
              ((QString *)CONCAT26(in_stack_fffffffffffffd3e.ucs,in_stack_fffffffffffffd38));
    pcVar7 = QByteArray::constData((QByteArray *)0x108007);
    fprintf(pFVar8,"Unhandled line entry \"%s\" in %s\n",pcVar5,pcVar7);
    QByteArray::~QByteArray((QByteArray *)0x10802f);
    QByteArray::~QByteArray((QByteArray *)0x10803c);
    local_211 = false;
LAB_00108113:
    QString::~QString((QString *)0x108120);
    QString::~QString((QString *)0x10812d);
    QString::~QString((QString *)0x10813a);
    QString::~QString((QString *)0x108147);
    QString::~QString((QString *)0x108154);
    QString::~QString((QString *)0x108161);
    QString::~QString((QString *)0x10816e);
    QTextStream::~QTextStream((QTextStream *)in_stack_fffffffffffffd20);
    QList<QString>::~QList((QList<QString> *)0x108188);
    QList<QString>::~QList((QList<QString> *)0x108195);
    QString::~QString((QString *)0x1081a2);
  }
  QFile::~QFile((QFile *)0x1081af);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_211;
}

Assistant:

static bool readParseCache(ParseCacheMap &entries, const QString &parseCacheFilePath)
{

    QFile file(parseCacheFilePath);
    if (!file.open(QIODevice::ReadOnly | QIODevice::Text)) {
        fprintf(stderr, "Could not open: %s\n", qPrintable(parseCacheFilePath));
        return false;
    }

    QString source;
    QStringList mocEntries;
    QStringList mocIncludes;

    // File format
    // ....
    // header/source path N
    //  mmc:Q_OBJECT| mcc:Q_GADGET # This file has been mocked
    //  miu:moc_....cpp # Path of the moc.cpp file generated for the above file
    //  relative to TARGET_BINARY_DIR/TARGET_autgen/include directory. Not
    //  present for headers.
    //  mid: ....moc # Path of .moc file generated for the above file relative
    //  to TARGET_BINARY_DIR/TARGET_autogen/include directory.
    //  uic: UI related info, ignored
    //  mdp: Moc dependencies, ignored
    //  udp: UI dependencies, ignored
    // header/source path N + 1
    // ....

    QTextStream textStream(&file);
    const QString mmcKey = QString(" mmc:"_L1);
    const QString miuKey = QString(" miu:"_L1);
    const QString uicKey = QString(" uic:"_L1);
    const QString midKey = QString(" mid:"_L1);
    const QString mdpKey = QString(" mdp:"_L1);
    const QString udpKey = QString(" udp:"_L1);
    QString line;
    bool mmc_key_found = false;
    while (textStream.readLineInto(&line)) {
        if (!line.startsWith(u' ')) {
            if (!mocEntries.isEmpty() || mmc_key_found || !mocIncludes.isEmpty()) {
                entries.insert(source,
                               ParseCacheEntry { std::move(mocEntries), std::move(mocIncludes) });
                source.clear();
                mocEntries = {};
                mocIncludes = {};
                mmc_key_found = false;
            }
            source = line;
        } else if (line.startsWith(mmcKey)) {
            mmc_key_found = true;
        } else if (line.startsWith(miuKey)) {
            mocIncludes.push_back(line.right(line.size() - miuKey.size()));
        } else if (line.startsWith(midKey)) {
            mocEntries.push_back(line.right(line.size() - midKey.size()));
        } else if (line.startsWith(uicKey) || line.startsWith(mdpKey) || line.startsWith(udpKey)) {
            // nothing to do ignore
            continue;
        } else {
            fprintf(stderr, "Unhandled line entry \"%s\" in %s\n", qPrintable(line),
                    qPrintable(parseCacheFilePath));
            return false;
        }
    }

    // Check if last entry has any data left to processed
    if (!mocEntries.isEmpty() || !mocIncludes.isEmpty() || mmc_key_found) {
        entries.insert(source, ParseCacheEntry { std::move(mocEntries), std::move(mocIncludes) });
    }

    file.close();
    return true;
}